

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
MuteGameCommand::trigger
          (MuteGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  char *pcVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_whitespace;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  size_t local_1d0;
  char *local_1c8;
  size_t local_1c0;
  char *local_1b8;
  allocator<char> local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  __sv_type local_148;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  string_view local_118;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  __sv_type local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  size_t local_a8;
  size_t local_a0;
  char *local_98;
  PlayerInfo *target;
  char *local_88;
  undefined1 local_80 [8];
  string_view reason;
  basic_string_view<char,_std::char_traits<char>_> *local_60;
  basic_string_view<char,_std::char_traits<char>_> *local_58;
  undefined1 local_50 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  PlayerInfo *player_local;
  Server *source_local;
  MuteGameCommand *this_local;
  string_view parameters_local;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_str;
  in_whitespace = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_len;
  local_60 = in_whitespace;
  local_58 = args_2;
  split_parameters.second._M_str = (char *)player;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&reason._M_str," \t");
  jessilib::
  word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_50,(jessilib *)&local_60,
             (basic_string_view<char,_std::char_traits<char>_> *)&reason._M_str,in_whitespace);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  pcVar1 = split_parameters.second._M_str;
  if (bVar2) {
    bVar3 = sv("Error: Too few parameters. Syntax: mute <player> [Reason]",0x39);
    local_1d0 = bVar3._M_len;
    local_1c8 = bVar3._M_str;
    RenX::Server::sendMessage(source,pcVar1,local_1d0,local_1c8);
  }
  else {
    local_80 = (undefined1  [8])split_parameters.first._M_str;
    reason._M_len = split_parameters.second._M_len;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_80);
    if (bVar2) {
      _target = sv("No reason",9);
      local_80 = (undefined1  [8])target;
      reason._M_len = (size_t)local_88;
    }
    local_a8 = (size_t)local_50;
    local_a0 = split_parameters.first._M_len;
    local_98 = (char *)RenX::Server::getPlayerByPartName
                                 (source,local_50,split_parameters.first._M_len);
    pcVar1 = split_parameters.second._M_str;
    if (local_98 == (char *)0x0) {
      local_b8 = sv("Error: Player not found.",0x18);
      RenX::Server::sendMessage(source,pcVar1,local_b8._M_len,local_b8._M_str);
    }
    else if (split_parameters.second._M_str == local_98) {
      local_c8 = sv("Error: You cannot mute yourself.",0x20);
      RenX::Server::sendMessage(source,pcVar1,local_c8._M_len,local_c8._M_str);
    }
    else if (*(int *)(local_98 + 0x1b0) < *(int *)(split_parameters.second._M_str + 0x1b0)) {
      RenX::Server::mute((PlayerInfo *)source);
      pcVar1 = local_98;
      s_abi_cxx11_(&local_188,"You have been muted for: ",0x19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_1a8,(basic_string_view<char,_std::char_traits<char>_> *)local_80,
                 &local_1a9);
      std::operator+(&local_168,&local_188,&local_1a8);
      local_148 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_168);
      RenX::Server::sendMessage(source,pcVar1,local_148._M_len,local_148._M_str);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      std::__cxx11::string::~string((string *)&local_188);
      pcVar1 = split_parameters.second._M_str;
      bVar3 = sv("Player has been muted from chat.",0x20);
      local_1c0 = bVar3._M_len;
      local_1b8 = bVar3._M_str;
      RenX::Server::sendMessage(source,pcVar1,local_1c0,local_1b8);
    }
    else {
      local_108 = sv("Error: You can not mute higher level ",0x25);
      local_118 = RenX_CommandsPlugin::getStaffTitle(&pluginInstance);
      local_128 = sv("s.",2);
      jessilib::
      join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (&local_f8,(jessilib *)&local_108,&local_118,&local_128,args_2);
      local_d8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f8);
      RenX::Server::sendMessage(source,pcVar1,local_d8._M_len,local_d8._M_str);
      std::__cxx11::string::~string((string *)&local_f8);
    }
  }
  return;
}

Assistant:

void MuteGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.first.empty()) {
		std::string_view reason = split_parameters.second;
		if (reason.empty()) {
			reason = "No reason"sv;
		}
		RenX::PlayerInfo *target = source->getPlayerByPartName(split_parameters.first);
		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (player == target)
			source->sendMessage(*player, "Error: You cannot mute yourself."sv);
		else if (target->access >= player->access)
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can not mute higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		else
		{
			source->mute(*target);
			source->sendMessage(*target, "You have been muted for: "s + std::string{reason});
			source->sendMessage(*player, "Player has been muted from chat."sv);
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: mute <player> [Reason]"sv);
}